

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O2

int main(int ac,char **av)

{
  int iVar1;
  ulong uVar2;
  long nSeed;
  FILE *pFVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  char qname [10];
  char line [512];
  
  prog = *av;
  flags = 0;
  flt_scale = 1.0;
  d_path = (char *)0x0;
  process_options(ac,av);
  if ((flags & 0x10U) != 0) {
    fprintf(_stdout,"-- TPC %s Parameter Substitution (Version %d.%d.%d%s)\n",
            "SSB (Star Schema Benchmark)",1,0,0,"");
  }
  setup();
  if ((flags & 1U) == 0) {
    if (((uint)flags >> 10 & 1) == 0) {
      uVar2 = time((time_t *)0x0);
      rndm = uVar2 & 0xffffffff;
    }
    else if (rndm < 0) {
      rndm = rndm + 0x7fffffff;
    }
    nSeed = rndm;
    Seed[0].value = rndm;
    for (lVar8 = 0x28; lVar8 != 0x2e8; lVar8 = lVar8 + 0x20) {
      nSeed = NextRand(nSeed);
      Seed[0].value = nSeed;
      *(long *)((long)&Seed[0].table + lVar8) = nSeed;
    }
    printf("-- using %ld as a seed to the RNG\n",rndm);
  }
  else {
    puts("-- using default substitutions");
  }
  if ((flags & 0x1000U) != 0) {
    pFVar3 = fopen64(ifile,"r");
    if (pFVar3 == (FILE *)0x0) {
      uVar7 = 0x1b3;
      pcVar4 = ifile;
      goto LAB_00104b0c;
    }
    while (pcVar4 = fgets(line,0x200,pFVar3), pcVar4 != (char *)0x0) {
      fputs(line,_stdout);
    }
  }
  lVar8 = (long)_optind;
  if (snum < 0) {
    if (_optind < ac) {
      for (; lVar8 < ac; lVar8 = lVar8 + 1) {
        qsub(av[lVar8],flags);
      }
    }
    else {
      for (uVar6 = 1; uVar6 != 0x17; uVar6 = uVar6 + 1) {
        sprintf(qname,"%d",(ulong)uVar6);
        qsub(qname,flags);
      }
    }
  }
  else if (_optind < ac) {
    for (; lVar8 < ac; lVar8 = lVar8 + 1) {
      iVar5 = snum % 0x29;
      iVar1 = atoi(av[lVar8]);
      sprintf(qname,"%ld",*(undefined8 *)((long)iVar5 * 0xb0 + 0x10a528 + (long)iVar1 * 8));
      qsub(qname,flags);
    }
  }
  else {
    for (lVar8 = 0; lVar8 != 0xb0; lVar8 = lVar8 + 8) {
      sprintf(qname,"%ld",*(undefined8 *)((long)permutation[snum % 0x29] + lVar8));
      qsub(qname,flags);
    }
  }
  if ((flags & 0x2000U) != 0) {
    pFVar3 = fopen64(tfile,"r");
    if (pFVar3 == (FILE *)0x0) {
      uVar7 = 0x1d7;
      pcVar4 = tfile;
LAB_00104b0c:
      fprintf(_stderr,"Open failed for %s at %s:%d\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",
              uVar7);
      exit(1);
    }
    while (pcVar4 = fgets(line,0x200,pFVar3), pcVar4 != (char *)0x0) {
      fputs(line,_stdout);
    }
  }
  return 0;
}

Assistant:

int main(int ac, char **av)
{
    int i;
    FILE *ifp;
    char line[LINE_SIZE];

    prog = av[0];
    flt_scale = (double)1.0;
    flags = 0;
	d_path = NULL;
    process_options(ac, av);
    if (flags & VERBOSE)
        fprintf(ofp, 
	    "-- TPC %s Parameter Substitution (Version %d.%d.%d%s)\n",
            NAME, VERSION, RELEASE, MODIFICATION, PATCH);

    setup();

    if (!(flags & DFLT))        /* perturb the RNG */
	    {
	    if (!(flags & SEED))
            {
			/* Note:
			 * The multiplication by the process ID is a change in ssb-dbgen relative to TPC-H dbgen 
			 */
            rndm = (long)((unsigned)time(NULL) * DSS_PROC);
            }
		if (rndm < 0)
			rndm += 2147483647;
		Seed[0].value = rndm;
		for (i=1; i <= QUERIES_PER_SET; i++)
			{
			Seed[0].value = NextRand(Seed[0].value);
			Seed[i].value = Seed[0].value;
			}
		printf("-- using %ld as a seed to the RNG\n", rndm);
		}
    else
        printf("-- using default substitutions\n");
    
    if (flags & INIT)           /* init stream with ifile */
        {
        ifp = fopen(ifile, "r");
	OPEN_CHECK(ifp, ifile);
        while (fgets(line, LINE_SIZE, ifp) != NULL)
            fprintf(stdout, "%s", line);
        }

    if (snum >= 0)
        if (optind < ac)
            for (i=optind; i < ac; i++)
                {
                char qname[10];
                sprintf(qname, "%ld", SEQUENCE(snum, atoi(av[i])));
                qsub(qname, flags);
                }
        else
            for (i=1; i <= QUERIES_PER_SET; i++)
                {
                char qname[10];
                sprintf(qname, "%ld", SEQUENCE(snum, i));
                qsub(qname, flags);
                }
    else
        if (optind < ac)
            for (i=optind; i < ac; i++)
                qsub(av[i], flags);   
        else
            for (i=1; i <= QUERIES_PER_SET; i++)
                {
                char qname[10];
                sprintf(qname, "%d", i);
                qsub(qname, flags);
                }
    
    if (flags & TERMINATE)      /* terminate stream with tfile */
        {
        ifp = fopen(tfile, "r");
        if (ifp == NULL)
	OPEN_CHECK(ifp, tfile);
        while (fgets(line, LINE_SIZE, ifp) != NULL)
            fprintf(stdout, "%s", line);
        }

    return(0);
}